

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  stbi_uc *psVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  char *pcVar29;
  byte *pbVar30;
  long *in_FS_OFFSET;
  bool bVar31;
  stbi_uc *local_e8;
  stbi_uc *local_e0;
  byte *local_c0;
  ulong local_78;
  ulong uVar17;
  
  uVar26 = (ulong)x;
  bVar31 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar31;
  a_00 = a->s->img_n;
  lVar24 = (long)a_00;
  uVar7 = a_00 << bVar31;
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar31,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    pcVar29 = "outofmem";
  }
  else {
    iVar8 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar8 == 0) {
      pcVar29 = "too large";
    }
    else {
      uVar9 = a_00 * x;
      uVar15 = uVar9 * depth + 7 >> 3;
      uVar17 = (ulong)uVar15;
      if ((uVar15 + 1) * y <= raw_len) {
        lVar18 = -(ulong)uVar6;
        lVar22 = (long)(out_n << bVar31);
        lVar23 = -lVar22;
        uVar16 = 0;
        uVar21 = 0;
        local_78 = uVar26;
        do {
          if (uVar21 == y) {
            if (depth < 8) {
              uVar7 = 0;
              for (uVar21 = 0; uVar21 != y; uVar21 = uVar21 + 1) {
                bVar4 = 1;
                if (color == 0) {
                  bVar4 = ""[depth];
                }
                uVar27 = (ulong)uVar7;
                psVar10 = a->out;
                uVar14 = (ulong)(uVar6 * (int)uVar21);
                if (depth == 4) {
                  lVar24 = (uVar5 - uVar17) + uVar27;
                  lVar18 = 0;
                  for (uVar15 = uVar9; 1 < (int)uVar15; uVar15 = uVar15 - 2) {
                    psVar10[lVar18 * 2 + uVar27] = (psVar10[lVar18 + lVar24] >> 4) * bVar4;
                    psVar10[lVar18 * 2 + uVar27 + 1] = (psVar10[lVar18 + lVar24] & 0xf) * bVar4;
                    lVar18 = lVar18 + 1;
                  }
                  if (uVar15 == 1) {
                    psVar10[lVar18 * 2 + uVar27] = (psVar10[lVar18 + lVar24] >> 4) * bVar4;
                  }
                }
                else {
                  pbVar30 = psVar10 + ((uVar5 + uVar14) - uVar17);
                  if (depth == 2) {
                    psVar10 = psVar10 + uVar27 + 3;
                    for (uVar15 = uVar9; 3 < (int)uVar15; uVar15 = uVar15 - 4) {
                      psVar10[-3] = (*pbVar30 >> 6) * bVar4;
                      psVar10[-2] = (*pbVar30 >> 4 & 3) * bVar4;
                      psVar10[-1] = (*pbVar30 >> 2 & 3) * bVar4;
                      *psVar10 = (*pbVar30 & 3) * bVar4;
                      pbVar30 = pbVar30 + 1;
                      psVar10 = psVar10 + 4;
                    }
                    if (((0 < (int)uVar15) && (psVar10[-3] = (*pbVar30 >> 6) * bVar4, uVar15 != 1))
                       && (psVar10[-2] = (*pbVar30 >> 4 & 3) * bVar4, uVar15 == 3)) {
                      psVar10[-1] = (*pbVar30 >> 2 & 3) * bVar4;
                    }
                  }
                  else if (depth == 1) {
                    pbVar11 = psVar10 + uVar27 + 7;
                    for (uVar15 = uVar9; 7 < (int)uVar15; uVar15 = uVar15 - 8) {
                      pbVar11[-7] = (char)*pbVar30 >> 7 & bVar4;
                      pbVar11[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar4;
                      pbVar11[-5] = (char)(*pbVar30 << 2) >> 7 & bVar4;
                      pbVar11[-4] = (char)(*pbVar30 << 3) >> 7 & bVar4;
                      pbVar11[-3] = (char)(*pbVar30 << 4) >> 7 & bVar4;
                      pbVar11[-2] = (char)(*pbVar30 << 5) >> 7 & bVar4;
                      pbVar11[-1] = (char)(*pbVar30 << 6) >> 7 & bVar4;
                      bVar20 = bVar4;
                      if ((*pbVar30 & 1) == 0) {
                        bVar20 = 0;
                      }
                      *pbVar11 = bVar20;
                      pbVar30 = pbVar30 + 1;
                      pbVar11 = pbVar11 + 8;
                    }
                    if (((((0 < (int)uVar15) &&
                          (pbVar11[-7] = (char)*pbVar30 >> 7 & bVar4, uVar15 != 1)) &&
                         ((pbVar11[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar4, 2 < uVar15 &&
                          ((pbVar11[-5] = (char)(*pbVar30 << 2) >> 7 & bVar4, uVar15 != 3 &&
                           (pbVar11[-4] = (char)(*pbVar30 << 3) >> 7 & bVar4, 4 < uVar15)))))) &&
                        (pbVar11[-3] = (char)(*pbVar30 << 4) >> 7 & bVar4, uVar15 != 5)) &&
                       (pbVar11[-2] = (char)(*pbVar30 << 5) >> 7 & bVar4, uVar15 == 7)) {
                      pbVar11[-1] = (char)(*pbVar30 << 6) >> 7 & bVar4;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar10 = a->out;
                  iVar8 = x - 1;
                  uVar27 = uVar26 * 3;
                  uVar15 = x * 4;
                  if (a_00 == 1) {
                    uVar15 = x * 2 - 1;
                    for (iVar8 = 0; -1 < (int)((x - 1) + iVar8); iVar8 = iVar8 + -1) {
                      psVar10[uVar15 + uVar14] = 0xff;
                      psVar10[(uVar15 - 1) + uVar14] =
                           psVar10[((x - 1) + iVar8 & 0x7fffffff) + uVar14];
                      uVar15 = uVar15 - 2;
                    }
                  }
                  else {
                    while( true ) {
                      uVar27 = uVar27 - 3;
                      if (iVar8 < 0) break;
                      psVar10[(uVar15 - 1) + uVar14] = 0xff;
                      uVar19 = uVar27 & 0xffffffff;
                      psVar10[(uVar15 - 2) + uVar14] = psVar10[uVar19 + uVar14 + 2];
                      psVar10[(uVar15 - 3) + uVar14] = psVar10[uVar19 + uVar14 + 1];
                      psVar10[(uVar15 - 4) + uVar14] = psVar10[uVar19 + uVar14];
                      iVar8 = iVar8 + -1;
                      uVar15 = uVar15 - 4;
                    }
                  }
                }
                uVar7 = uVar7 + uVar6;
              }
              return 1;
            }
            if (depth != 0x10) {
              return 1;
            }
            psVar10 = a->out;
            for (lVar24 = 0; uVar5 * y != (int)lVar24; lVar24 = lVar24 + 1) {
              puVar1 = (ushort *)(psVar10 + lVar24 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
            return 1;
          }
          uVar14 = (ulong)*raw;
          if (4 < uVar14) {
            pcVar29 = "invalid filter";
            goto LAB_001a3de3;
          }
          local_e8 = a->out + uVar6 * (int)uVar21;
          if (depth < 8) {
            if (x < uVar15) {
              pcVar29 = "invalid width";
              goto LAB_001a3de3;
            }
            local_e8 = local_e8 + (uVar5 - uVar15);
            uVar7 = 1;
            local_78 = uVar17;
          }
          if (uVar21 == 0) {
            uVar14 = (ulong)""[uVar14];
          }
          uVar27 = 0;
          if (0 < (int)uVar7) {
            uVar27 = (ulong)uVar7;
          }
          for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
            switch(uVar14) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar19 + 1];
              break;
            case 2:
              bVar4 = local_e8[uVar19 + lVar18];
              goto LAB_001a3fb9;
            case 3:
              bVar4 = local_e8[uVar19 + lVar18] >> 1;
LAB_001a3fb9:
              bVar4 = bVar4 + raw[uVar19 + 1];
              break;
            case 4:
              bVar4 = raw[uVar19 + 1];
              iVar8 = stbi__paeth(0,(uint)local_e8[uVar19 + lVar18],0);
              bVar4 = (char)iVar8 + bVar4;
              break;
            default:
              goto switchD_001a3f76_default;
            }
            local_e8[uVar19] = bVar4;
switchD_001a3f76_default:
          }
          lVar12 = (long)(int)uVar7;
          if (depth == 8) {
            lVar13 = (long)out_n;
            lVar2 = lVar24;
            if (a_00 != out_n) {
              local_e8[lVar24] = 0xff;
            }
LAB_001a402a:
            local_c0 = raw + lVar2 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar13 = lVar22;
              lVar2 = lVar12;
              if (a_00 != out_n) {
                local_e8[lVar12] = 0xff;
                local_e8[lVar12 + 1] = 0xff;
              }
              goto LAB_001a402a;
            }
            local_c0 = raw + 2;
            lVar13 = 1;
          }
          psVar10 = local_e8 + lVar13;
          local_e0 = local_e8 + lVar13 + lVar18;
          if (a_00 == out_n || depth < 8) {
            uVar28 = ((int)local_78 + -1) * uVar7;
            switch(uVar14) {
            case 0:
              memcpy(psVar10,local_c0,(long)(int)uVar28);
              break;
            case 1:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                psVar10[uVar14] = psVar10[uVar14 - lVar12] + local_c0[uVar14];
              }
              break;
            case 2:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                psVar10[uVar14] = psVar10[uVar14 + lVar18] + local_c0[uVar14];
              }
              break;
            case 3:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              uVar14 = (ulong)uVar3;
              pbVar30 = local_c0;
              while (bVar31 = uVar14 != 0, uVar14 = uVar14 - 1, bVar31) {
                *psVar10 = (char)((uint)psVar10[-lVar12] + (uint)psVar10[lVar18] >> 1) + *pbVar30;
                psVar10 = psVar10 + 1;
                pbVar30 = pbVar30 + 1;
              }
              break;
            case 4:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar14 != uVar3; uVar14 = uVar14 + 1) {
                bVar4 = local_c0[uVar14];
                iVar8 = stbi__paeth((uint)psVar10[uVar14 - lVar12],(uint)local_e0[uVar14],
                                    (uint)local_e0[uVar14 - lVar12]);
                psVar10[uVar14] = (char)iVar8 + bVar4;
              }
              break;
            case 5:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                psVar10[uVar14] = (psVar10[uVar14 - lVar12] >> 1) + local_c0[uVar14];
              }
              break;
            case 6:
              uVar3 = uVar28;
              if ((int)uVar28 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                psVar10[uVar14] = psVar10[uVar14 - lVar12] + local_c0[uVar14];
              }
            }
            local_c0 = local_c0 + (int)uVar28;
          }
          else {
            switch(uVar14) {
            case 0:
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar14 = (ulong)uVar28, uVar28 != 0) {
                for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  psVar10[uVar19] = local_c0[uVar19];
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
              }
              break;
            case 1:
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar14 = (ulong)uVar28, uVar28 != 0) {
                for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  psVar10[uVar19] = psVar10[uVar19 + lVar23] + local_c0[uVar19];
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
              }
              break;
            case 2:
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar14 = (ulong)uVar28, uVar28 != 0) {
                for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  psVar10[uVar19] = psVar10[uVar19 + lVar18] + local_c0[uVar19];
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
              }
              break;
            case 3:
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar14 = (ulong)uVar28, pbVar30 = local_c0,
                    psVar25 = psVar10, uVar19 = uVar27, uVar28 != 0) {
                while (uVar19 != 0) {
                  *psVar25 = (char)((uint)psVar25[lVar23] + (uint)psVar25[lVar18] >> 1) + *pbVar30;
                  pbVar30 = pbVar30 + 1;
                  psVar25 = psVar25 + 1;
                  uVar19 = uVar19 - 1;
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
              }
              break;
            case 4:
              psVar25 = local_e8 + lVar13 + lVar23;
              local_e8 = local_e8 + lVar13 + (lVar23 - (ulong)uVar6);
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar28 != 0) {
                for (uVar14 = 0; uVar27 != uVar14; uVar14 = uVar14 + 1) {
                  bVar4 = local_c0[uVar14];
                  iVar8 = stbi__paeth((uint)psVar25[uVar14],(uint)local_e0[uVar14],
                                      (uint)local_e8[uVar14]);
                  psVar10[uVar14] = (char)iVar8 + bVar4;
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
                local_e0 = local_e0 + lVar22;
                psVar25 = psVar25 + lVar22;
                local_e8 = local_e8 + lVar22;
                uVar14 = (ulong)uVar28;
              }
              break;
            case 5:
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar14 = (ulong)uVar28, uVar28 != 0) {
                for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  psVar10[uVar19] = (psVar10[uVar19 + lVar23] >> 1) + local_c0[uVar19];
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
              }
              break;
            case 6:
              uVar14 = uVar26;
              while (uVar28 = (int)uVar14 - 1, uVar14 = (ulong)uVar28, uVar28 != 0) {
                for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
                  psVar10[uVar19] = psVar10[uVar19 + lVar23] + local_c0[uVar19];
                }
                psVar10[lVar12] = 0xff;
                local_c0 = local_c0 + lVar12;
                psVar10 = psVar10 + lVar22;
              }
            }
            if (depth == 0x10) {
              psVar10 = a->out + (long)(int)(uVar7 + 1) + (ulong)uVar16;
              uVar14 = uVar26;
              while (iVar8 = (int)uVar14, uVar14 = (ulong)(iVar8 - 1), iVar8 != 0) {
                *psVar10 = 0xff;
                psVar10 = psVar10 + lVar22;
              }
            }
          }
          uVar21 = uVar21 + 1;
          uVar16 = uVar16 + uVar6;
          raw = local_c0;
        } while( true );
      }
      pcVar29 = "not enough pixels";
    }
  }
LAB_001a3de3:
  *(char **)(*in_FS_OFFSET + -0x20) = pcVar29;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }